

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datareader.cpp
# Opt level: O3

int __thiscall ncnn::DataReaderFromMemory::scan(DataReaderFromMemory *this,char *format,void *p)

{
  uint in_EAX;
  int iVar1;
  size_t sVar2;
  char *__s;
  int nconsumed;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  sVar2 = strlen(format);
  __s = (char *)operator_new__(sVar2 + 3);
  sprintf(__s,"%s%%n",format);
  uStack_38 = (ulong)(uint)uStack_38;
  iVar1 = __isoc99_sscanf(*this->mem,__s,p,(long)&uStack_38 + 4);
  *this->mem = *this->mem + uStack_38._4_4_;
  operator_delete__(__s);
  if (uStack_38._4_4_ < 1) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int DataReaderFromMemory::scan(const char* format, void* p) const
{
    size_t fmtlen = strlen(format);

    char* format_with_n = new char[fmtlen + 3];
    sprintf(format_with_n, "%s%%n", format);

    int nconsumed = 0;
    int nscan = sscanf((const char*)mem, format_with_n, p, &nconsumed);
    mem += nconsumed;

    delete[] format_with_n;

    return nconsumed > 0 ? nscan : 0;
}